

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O2

unsigned_long ffdsum(char *ascii,int complm,unsigned_long *sum)

{
  long lVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  char cStack_19;
  char cbuf [16];
  
  for (lVar1 = 1; lVar1 != 0x11; lVar1 = lVar1 + 1) {
    cbuf[lVar1 + -1] = ascii[(uint)lVar1 & 0xf] + -0x30;
  }
  uVar4 = 0;
  uVar2 = 0;
  for (uVar5 = 0; uVar5 < 0x10; uVar5 = uVar5 + 4) {
    uVar4 = uVar4 + (long)cbuf[uVar5 + 1] + (long)cbuf[uVar5] * 0x100;
    uVar2 = uVar2 + (long)cbuf[uVar5 + 3] + (long)cbuf[uVar5 + 2] * 0x100;
  }
  for (; 0xffff < uVar2 || 0xffff < uVar4; uVar2 = (uVar2 & 0xffff) + uVar5) {
    uVar5 = uVar4 >> 0x10;
    uVar4 = (uVar4 & 0xffff) + (uVar2 >> 0x10);
  }
  uVar2 = uVar4 << 0x10 | uVar2;
  uVar3 = 0xffffffff - uVar2;
  if (complm == 0) {
    uVar3 = uVar2;
  }
  *sum = uVar3;
  return uVar3;
}

Assistant:

unsigned long ffdsum(char *ascii,  /* I - 16-char ASCII encoded checksum   */
                     int complm,   /* I - =1 to decode complement of the   */
                     unsigned long *sum)  /* O - 32-bit checksum           */
/*
    decode the 16-char ASCII encoded checksum into an unsigned 32-bit long.
    If complm=TRUE, then the complement of the sum will be decoded.

    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,
    published in the Astronomical Society of the Pacific Conference Series.
*/
{
    char cbuf[16];
    unsigned long hi = 0, lo = 0, hicarry, locarry;
    int ii;

    /* remove the permuted FITS byte alignment and the ASCII 0 offset */
    for (ii = 0; ii < 16; ii++)
    {
        cbuf[ii] = ascii[(ii+1)%16];
        cbuf[ii] -= 0x30;
    }

    for (ii = 0; ii < 16; ii += 4)
    {
        hi += (cbuf[ii]   << 8) + cbuf[ii+1];
        lo += (cbuf[ii+2] << 8) + cbuf[ii+3];
    }

    hicarry = hi >> 16;
    locarry = lo >> 16;
    while (hicarry || locarry)
    {
        hi = (hi & 0xFFFF) + locarry;
        lo = (lo & 0xFFFF) + hicarry;
        hicarry = hi >> 16;
        locarry = lo >> 16;
    }

    *sum = (hi << 16) + lo;
    if (complm)
        *sum = 0xFFFFFFFF - *sum;   /* complement each bit of the value */

    return(*sum);
}